

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecInt.h
# Opt level: O2

void Vec_IntSelectSort(int *pArray,int nSize)

{
  int iVar1;
  ulong uVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  int iVar7;
  ulong uVar8;
  
  iVar3 = 1;
  if (1 < nSize) {
    iVar3 = nSize;
  }
  uVar4 = 1;
  for (uVar5 = 0; uVar5 != iVar3 - 1; uVar5 = uVar5 + 1) {
    uVar8 = uVar5 & 0xffffffff;
    for (uVar6 = uVar4; iVar7 = (int)uVar8, (uint)nSize != uVar6; uVar6 = uVar6 + 1) {
      uVar2 = uVar6 & 0xffffffff;
      if (pArray[iVar7] <= pArray[uVar6]) {
        uVar2 = uVar8;
      }
      uVar8 = uVar2;
    }
    iVar1 = pArray[uVar5];
    pArray[uVar5] = pArray[iVar7];
    pArray[iVar7] = iVar1;
    uVar4 = uVar4 + 1;
  }
  return;
}

Assistant:

static inline void Vec_IntSelectSort( int * pArray, int nSize )
{
    int temp, i, j, best_i;
    for ( i = 0; i < nSize-1; i++ )
    {
        best_i = i;
        for ( j = i+1; j < nSize; j++ )
            if ( pArray[j] < pArray[best_i] )
                best_i = j;
        temp = pArray[i]; 
        pArray[i] = pArray[best_i]; 
        pArray[best_i] = temp;
    }
}